

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

void __thiscall
option::Parser::Parser
          (Parser *this,bool gnu,Descriptor *usage,int argc,char **argv,Option *options,
          Option *buffer,int min_abbr_len,bool single_minus_longopt,int bufmax)

{
  bool bVar1;
  int iVar2;
  Descriptor **ppDVar3;
  StoreOptionAction action;
  
  this->op_count = 0;
  this->nonop_count = 0;
  this->nonop_args = (char **)0x0;
  this->err = false;
  action.super_Action._vptr_Action = (_func_int **)&PTR_perform_00124d38;
  action.buffer = buffer;
  action.bufmax = bufmax;
  if (bufmax == 0) {
    iVar2 = 0;
  }
  else {
    ppDVar3 = &buffer->desc;
    iVar2 = 0;
    do {
      if ((buffer == (Option *)0x0) || (*ppDVar3 == (Descriptor *)0x0)) break;
      iVar2 = iVar2 + 1;
      ppDVar3 = ppDVar3 + 6;
    } while (iVar2 < bufmax || bufmax < 0);
  }
  this->op_count = iVar2;
  action.parser = this;
  action.options = options;
  bVar1 = workhorse(gnu,usage,argc,argv,&action.super_Action,single_minus_longopt,true,min_abbr_len)
  ;
  this->err = !bVar1;
  return;
}

Assistant:

Parser(bool gnu, const Descriptor usage[], int argc, char** argv, Option options[], Option buffer[],
         int min_abbr_len = 0, bool single_minus_longopt = false, int bufmax = -1) :
      op_count(0), nonop_count(0), nonop_args(0), err(false)
  {
    parse(gnu, usage, argc, (const char**) argv, options, buffer, min_abbr_len, single_minus_longopt, bufmax);
  }